

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
::allocate(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
           *this,value_type *v)

{
  container *pcVar1;
  iterator p;
  container_alloc al;
  value_type *in_stack_ffffffffffffffb8;
  container *this_00;
  size_type in_stack_ffffffffffffffc8;
  new_allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
  *in_stack_ffffffffffffffd0;
  
  this_00 = (container *)&stack0xffffffffffffffef;
  std::
  allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
  ::allocator((allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
               *)0x4483ed);
  pcVar1 = __gnu_cxx::
           new_allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
           ::allocate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,this_00);
  container::container(this_00,in_stack_ffffffffffffffb8);
  std::
  allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
  ::~allocator((allocator<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
                *)0x448491);
  return pcVar1;
}

Assistant:

iterator allocate(value_type const &v)
	{
		container_alloc al;
		iterator p = al.allocate(1);
		try {
			new (p) container(v);
		}
		catch(...) {
			al.deallocate(p,1);
			throw;
		}
		return p;
	}